

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cost_sensitive.cc
# Opt level: O0

void COST_SENSITIVE::name_value(substring *s,v_array<substring> *name,float *v)

{
  substring s_00;
  bool bVar1;
  size_t sVar2;
  undefined8 uVar3;
  float *in_RDX;
  v_array<substring> *in_RSI;
  long *in_RDI;
  float fVar4;
  stringstream __msg;
  undefined7 in_stack_fffffffffffffe08;
  undefined1 uVar5;
  int in_stack_fffffffffffffe14;
  char *in_stack_fffffffffffffe18;
  undefined7 in_stack_fffffffffffffe20;
  undefined1 in_stack_fffffffffffffe27;
  v_array<substring> *in_stack_fffffffffffffe28;
  char in_stack_fffffffffffffe37;
  substring *in_stack_fffffffffffffe38;
  ostream *in_stack_fffffffffffffe40;
  substring in_stack_fffffffffffffe58;
  
  s_00.end = (char *)in_stack_fffffffffffffe40;
  s_00.begin = (char *)in_stack_fffffffffffffe38;
  tokenize<v_array<substring>>
            (in_stack_fffffffffffffe37,s_00,in_stack_fffffffffffffe28,
             (bool)in_stack_fffffffffffffe27);
  sVar2 = v_array<substring>::size(in_RSI);
  if (sVar2 < 2) {
    *in_RDX = 1.0;
  }
  else if (sVar2 == 2) {
    v_array<substring>::operator[](in_RSI,1);
    fVar4 = float_of_substring(in_stack_fffffffffffffe58);
    *in_RDX = fVar4;
    bVar1 = nanpattern(0.0);
    if (bVar1) {
      std::__cxx11::stringstream::stringstream((stringstream *)&stack0xfffffffffffffe40);
      std::operator<<((ostream *)&stack0xfffffffffffffe50,"error NaN value for: ");
      v_array<substring>::operator[](in_RSI,0);
      ::operator<<(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
      uVar5 = 1;
      uVar3 = __cxa_allocate_exception(0x38);
      std::__cxx11::stringstream::str();
      VW::vw_exception::vw_exception
                ((vw_exception *)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20),
                 in_stack_fffffffffffffe18,in_stack_fffffffffffffe14,
                 (string *)CONCAT17(uVar5,in_stack_fffffffffffffe08));
      __cxa_throw(uVar3,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
  }
  else {
    std::operator<<((ostream *)&std::cerr,"example with a wierd name.  What is \'");
    std::ostream::write((char *)&std::cerr,*in_RDI);
    std::operator<<((ostream *)&std::cerr,"\'?\n");
  }
  return;
}

Assistant:

void name_value(substring& s, v_array<substring>& name, float& v)
{
  tokenize(':', s, name);

  switch (name.size())
  {
    case 0:
    case 1:
      v = 1.;
      break;
    case 2:
      v = float_of_substring(name[1]);
      if (nanpattern(v))
        THROW("error NaN value for: " << name[0]);
      break;
    default:
      cerr << "example with a wierd name.  What is '";
      cerr.write(s.begin, s.end - s.begin);
      cerr << "'?\n";
  }
}